

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

int Gia_ManCountPisWithFanout(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = 0;
  while ((iVar3 < p->vCis->nSize && (pGVar1 = Gia_ManCi(p,iVar3), pGVar1 != (Gia_Obj_t *)0x0))) {
    pGVar1->field_0x3 = pGVar1->field_0x3 & 0xbf;
    iVar3 = iVar3 + 1;
  }
  iVar3 = 0;
  while ((iVar3 < p->nObjs && (pGVar1 = Gia_ManObj(p,iVar3), pGVar1 != (Gia_Obj_t *)0x0))) {
    uVar2 = *(ulong *)pGVar1 & 0x1fffffff;
    if (uVar2 != 0x1fffffff && -1 < (int)*(ulong *)pGVar1) {
      pGVar1[-uVar2].field_0x3 = pGVar1[-uVar2].field_0x3 | 0x40;
      *(ulong *)(pGVar1 + -(ulong)(*(uint *)&pGVar1->field_0x4 & 0x1fffffff)) =
           *(ulong *)(pGVar1 + -(ulong)(*(uint *)&pGVar1->field_0x4 & 0x1fffffff)) | 0x40000000;
    }
    iVar3 = iVar3 + 1;
  }
  iVar3 = 0;
  while ((iVar3 < p->vCos->nSize && (pGVar1 = Gia_ManCo(p,iVar3), pGVar1 != (Gia_Obj_t *)0x0))) {
    *(ulong *)(pGVar1 + -(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff)) =
         *(ulong *)(pGVar1 + -(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff)) | 0x40000000;
    iVar3 = iVar3 + 1;
  }
  iVar4 = 0;
  iVar3 = 0;
  while ((iVar4 < p->vCis->nSize && (pGVar1 = Gia_ManCi(p,iVar4), pGVar1 != (Gia_Obj_t *)0x0))) {
    iVar3 = iVar3 + (uint)((*(uint *)pGVar1 >> 0x1e & 1) != 0);
    iVar4 = iVar4 + 1;
  }
  iVar4 = 0;
  while( true ) {
    if (p->nObjs <= iVar4) {
      return iVar3;
    }
    pGVar1 = Gia_ManObj(p,iVar4);
    if (pGVar1 == (Gia_Obj_t *)0x0) break;
    pGVar1->field_0x3 = pGVar1->field_0x3 & 0xbf;
    iVar4 = iVar4 + 1;
  }
  return iVar3;
}

Assistant:

int Gia_ManCountPisWithFanout( Gia_Man_t * p )
{
    Gia_Obj_t * pObj; 
    int i, Count = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->fMark0 = 0;
    Gia_ManForEachAnd( p, pObj, i )
    {
        Gia_ObjFanin0(pObj)->fMark0 = 1;
        Gia_ObjFanin1(pObj)->fMark0 = 1;
    }
    Gia_ManForEachCo( p, pObj, i )
        Gia_ObjFanin0(pObj)->fMark0 = 1;
    Gia_ManForEachCi( p, pObj, i )
        Count += pObj->fMark0;
    Gia_ManForEachObj( p, pObj, i )
        pObj->fMark0 = 0;
    return Count;
}